

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTActionEvents.cpp
# Opt level: O0

void TTD::NSLogEvents::CreateScriptContext_Emit
               (EventLogEntry *evt,FileWriter *writer,ThreadContext *threadContext)

{
  JsRTCreateScriptContextAction *pJVar1;
  JsRTCreateScriptContextAction *cAction;
  ThreadContext *threadContext_local;
  FileWriter *writer_local;
  EventLogEntry *evt_local;
  
  pJVar1 = GetInlineEventDataAs<TTD::NSLogEvents::JsRTCreateScriptContextAction,(TTD::NSLogEvents::EventKind)17>
                     (evt);
  FileWriter::WriteSequenceStart_DefaultKey(writer,CommaSeparator);
  FileWriter::WriteLogTag(writer,logTag,pJVar1->GlobalObject,NoSeparator);
  FileWriter::WriteLogTag(writer,logTag,pJVar1->KnownObjects->UndefinedObject,CommaSeparator);
  FileWriter::WriteLogTag(writer,logTag,pJVar1->KnownObjects->NullObject,CommaSeparator);
  FileWriter::WriteLogTag(writer,logTag,pJVar1->KnownObjects->TrueObject,CommaSeparator);
  FileWriter::WriteLogTag(writer,logTag,pJVar1->KnownObjects->FalseObject,CommaSeparator);
  (*writer->_vptr_FileWriter[5])(writer,0);
  return;
}

Assistant:

void CreateScriptContext_Emit(const EventLogEntry* evt, FileWriter* writer, ThreadContext* threadContext)
        {
            const JsRTCreateScriptContextAction* cAction = GetInlineEventDataAs<JsRTCreateScriptContextAction, EventKind::CreateScriptContextActionTag>(evt);

            writer->WriteSequenceStart_DefaultKey(NSTokens::Separator::CommaSeparator);
            writer->WriteLogTag(NSTokens::Key::logTag, cAction->GlobalObject, NSTokens::Separator::NoSeparator);
            writer->WriteLogTag(NSTokens::Key::logTag, cAction->KnownObjects->UndefinedObject, NSTokens::Separator::CommaSeparator);
            writer->WriteLogTag(NSTokens::Key::logTag, cAction->KnownObjects->NullObject, NSTokens::Separator::CommaSeparator);
            writer->WriteLogTag(NSTokens::Key::logTag, cAction->KnownObjects->TrueObject, NSTokens::Separator::CommaSeparator);
            writer->WriteLogTag(NSTokens::Key::logTag, cAction->KnownObjects->FalseObject, NSTokens::Separator::CommaSeparator);
            writer->WriteSequenceEnd();
        }